

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t
exr_attr_list_add_by_type
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,char *type,int32_t data_len,
          uint8_t **data_ptr,exr_attribute_t **attr)

{
  exr_attribute_t *peVar1;
  exr_attribute_t **ppeVar2;
  exr_result_t eVar3;
  int iVar4;
  exr_attribute_type_t eVar5;
  char *name_00;
  char *pcVar6;
  ulong uVar7;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  long lVar8;
  exr_attribute_t *local_58;
  exr_attribute_t **local_50;
  size_t local_48;
  size_t local_40;
  exr_attribute_list_t *local_38;
  
  local_58 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((type == (char *)0x0) || (*type == '\0')) {
    eVar3 = (*ctxt->report_error)(ctxt,3,"Invalid type to add_by_type");
    return eVar3;
  }
  eVar3 = validate_attr_arguments(ctxt,list,name,data_len,data_ptr,attr);
  if (eVar3 == 0) {
    local_38 = list;
    local_40 = strlen(name);
    uVar7 = (ulong)ctxt->max_name_length;
    if (uVar7 < local_40) {
      UNRECOVERED_JUMPTABLE = ctxt->print_error;
      pcVar6 = "Provided name \'%s\' too long for file (len %d, max %d)";
LAB_00115b11:
      eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,0xc,pcVar6,name,local_40 & 0xffffffff,uVar7);
      return eVar3;
    }
    local_48 = local_40;
    local_40 = strlen(type);
    if (uVar7 < local_40) {
      UNRECOVERED_JUMPTABLE = ctxt->print_error;
      pcVar6 = "Provided type name \'%s\' too long for file (len %d, max %d)";
      name = type;
      goto LAB_00115b11;
    }
    local_50 = attr;
    lVar8 = 0x10;
    do {
      pcVar6 = *(char **)((long)&__frame_dummy_init_array_entry + lVar8);
      iVar4 = strcmp(type,pcVar6);
      if (iVar4 == 0) {
        name_00 = (char *)(ulong)(uint)data_len;
        eVar3 = create_attr_block(ctxt,&local_58,
                                  *(size_t *)((long)&the_predefined_attr_typenames[0].name + lVar8),
                                  data_len,data_ptr,name,(int32_t)local_48,(char *)0x0,0);
        if (eVar3 != 0) goto LAB_00115c23;
        local_58->type_name = pcVar6;
        local_58->type_name_length =
             *(uint8_t *)((long)&__do_global_dtors_aux_fini_array_entry + lVar8);
        eVar5 = *(exr_attribute_type_t *)((long)&__do_global_dtors_aux_fini_array_entry + lVar8 + 4)
        ;
        goto LAB_00115c0b;
      }
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x2c8);
    name_00 = (char *)(ulong)(uint)data_len;
    eVar3 = create_attr_block(ctxt,&local_58,0x38,data_len,data_ptr,name,(int32_t)local_48,type,
                              (int32_t)local_40);
    if (eVar3 == 0) {
      eVar5 = EXR_ATTR_OPAQUE;
LAB_00115c0b:
      ppeVar2 = local_50;
      peVar1 = local_58;
      local_58->type = eVar5;
      eVar3 = add_to_list(ctxt,local_38,local_58,name_00);
      if (eVar3 == 0) {
        *ppeVar2 = peVar1;
        check_attr_handler(ctxt,peVar1);
        goto LAB_00115c47;
      }
    }
LAB_00115c23:
    if (data_ptr != (uint8_t **)0x0) {
      *data_ptr = (uint8_t *)0x0;
    }
  }
  else {
    if (-1 < eVar3) {
      return eVar3;
    }
    peVar1 = *attr;
    iVar4 = strcmp(type,peVar1->type_name);
    if (iVar4 != 0) {
      *attr = (exr_attribute_t *)0x0;
      eVar3 = (*ctxt->print_error)
                        (ctxt,3,
                         "Entry \'%s\' already in list but with different type (\'%s\' vs requested \'%s\')"
                         ,name,peVar1->type_name,type);
      return eVar3;
    }
LAB_00115c47:
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_list_add_by_type (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    const char*           type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    exr_result_t     rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tlen, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!type || type[0] == '\0')
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid type to add_by_type");
    }

    rval = validate_attr_arguments (ctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if (0 != strcmp (type, (*attr)->type_name))
            {
                nattr = *attr;
                *attr = NULL;
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s' vs requested '%s')",
                    name,
                    nattr->type_name,
                    type);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    slen = strlen (name);
    mlen = (int32_t) ctxt->max_name_length;

    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    slen = strlen (type);
    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen);
    }
    tlen = (int32_t) slen;

    for (int i = 0; i < the_predefined_attr_count; ++i)
    {
        if (0 == strcmp (type, the_predefined_attr_typenames[i].name))
        {
            known = &(the_predefined_attr_typenames[i]);
            break;
        }
    }

    if (known)
    {
        rval = create_attr_block (
            ctxt,
            &nattr,
            known->exp_size,
            data_len,
            data_ptr,
            name,
            nlen,
            NULL,
            0);

        if (rval == EXR_ERR_SUCCESS)
        {
            nattr->type_name        = known->name;
            nattr->type_name_length = (uint8_t) known->name_len;
            nattr->type             = known->type;
        }
    }
    else
    {
        rval = create_attr_block (
            ctxt,
            &nattr,
            sizeof (exr_attr_opaquedata_t),
            data_len,
            data_ptr,
            name,
            nlen,
            type,
            tlen);

        if (rval == EXR_ERR_SUCCESS) nattr->type = EXR_ATTR_OPAQUE;
    }
    if (rval == EXR_ERR_SUCCESS) rval = add_to_list (ctxt, list, nattr, name);
    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (ctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;

    return rval;
}